

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

void __thiscall ON_Extrusion::ON_Extrusion(ON_Extrusion *this,ON_Extrusion *src)

{
  ON_Surface::ON_Surface(&this->super_ON_Surface,&src->super_ON_Surface);
  (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081a9b0;
  ON_Line::ON_Line(&this->m_path);
  ON_Interval::ON_Interval(&this->m_t);
  this->m_profile = (ON_Curve *)0x0;
  ON_Interval::ON_Interval(&this->m_path_domain);
  ON_MeshCache::ON_MeshCache(&this->m_mesh_cache,&ON_MeshCache::Empty);
  ON_ExtrusionCopyHelper(src,this);
  return;
}

Assistant:

ON_Extrusion::ON_Extrusion(const ON_Extrusion& src) : ON_Surface(src), m_profile(0)
{
  ON_ExtrusionCopyHelper(src,*this);
}